

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O0

void Dar_ManRefPrintStats(Ref_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int Gain;
  Ref_Man_t *p_local;
  
  iVar1 = p->nNodesInit;
  iVar4 = Aig_ManNodeNum(p->pAig);
  uVar5 = iVar1 - iVar4;
  uVar2 = p->nNodesInit;
  uVar6 = Aig_ManNodeNum(p->pAig);
  printf("NodesBeg = %8d. NodesEnd = %8d. Gain = %6d. (%6.2f %%).\n",
         ((double)(int)uVar5 * 100.0) / (double)p->nNodesInit,(ulong)uVar2,(ulong)uVar6,(ulong)uVar5
        );
  uVar2 = p->nNodesTried;
  uVar5 = p->nNodesBelow;
  uVar6 = p->nNodesExten;
  uVar3 = p->nCutsUsed;
  uVar7 = Aig_ManLevels(p->pAig);
  printf("Tried = %6d. Below = %5d. Extended = %5d.  Used = %5d.  Levels = %4d.\n",(ulong)uVar2,
         (ulong)uVar5,(ulong)uVar6,(ulong)uVar3,(ulong)uVar7);
  Abc_Print(1,"%s =","Cuts  ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeCuts * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","Eval  ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeEval * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","Other ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeOther * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","TOTAL ");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeTotal * 1.0) / 1000000.0);
  return;
}

Assistant:

void Dar_ManRefPrintStats( Ref_Man_t * p )
{
    int Gain = p->nNodesInit - Aig_ManNodeNum(p->pAig);
    printf( "NodesBeg = %8d. NodesEnd = %8d. Gain = %6d. (%6.2f %%).\n", 
        p->nNodesInit, Aig_ManNodeNum(p->pAig), Gain, 100.0*Gain/p->nNodesInit );
    printf( "Tried = %6d. Below = %5d. Extended = %5d.  Used = %5d.  Levels = %4d.\n", 
        p->nNodesTried, p->nNodesBelow, p->nNodesExten, p->nCutsUsed, Aig_ManLevels(p->pAig) );
    ABC_PRT( "Cuts  ", p->timeCuts );
    ABC_PRT( "Eval  ", p->timeEval );
    ABC_PRT( "Other ", p->timeOther );
    ABC_PRT( "TOTAL ", p->timeTotal );
}